

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecFadds.c
# Opt level: O2

Vec_Wec_t * Gia_ManCollectTopmost(Gia_Man_t *p,Vec_Int_t *vFadds,Vec_Int_t *vMap,int nFaddMin)

{
  uint *puVar1;
  ulong uVar2;
  ulong uVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  Vec_Int_t *p_00;
  Vec_Wec_t *pVVar7;
  void *__s;
  int iVar8;
  uint uVar9;
  uint uVar10;
  int i;
  uint iFaddTop;
  uint uVar11;
  size_t __size;
  int iVar12;
  ulong uVar13;
  Vec_Int_t *local_40;
  
  p_00 = Vec_IntAlloc(100);
  iVar4 = vFadds->nSize;
  uVar2 = (long)iVar4 / 5;
  pVVar7 = (Vec_Wec_t *)malloc(0x10);
  uVar3 = 8;
  if (6 < (int)uVar2 - 1U) {
    uVar3 = uVar2;
  }
  uVar13 = uVar3 & 0xffffffff;
  pVVar7->nSize = 0;
  iVar8 = (int)uVar3;
  pVVar7->nCap = iVar8;
  if (iVar8 == 0) {
    local_40 = (Vec_Int_t *)0x0;
  }
  else {
    local_40 = (Vec_Int_t *)calloc((long)iVar8,0x10);
  }
  pVVar7->pArray = local_40;
  iVar12 = 0;
  iVar8 = (((int)uVar2 >> 5) + 1) - (uint)((uVar2 & 0x1f) == 0);
  if (iVar8 == 0) {
    __size = 0;
    __s = (void *)0x0;
  }
  else {
    __size = (long)iVar8 << 2;
    __s = malloc(__size);
  }
  uVar9 = iVar8 * 0x20;
  memset(__s,0,__size);
  for (iVar8 = 0; iVar8 < iVar4 / 5; iVar8 = iVar8 + 1) {
    iVar4 = Vec_IntEntry(vFadds,iVar12);
    uVar5 = Vec_IntEntry(vMap,iVar4);
    if (-1 < (int)uVar5) {
      if ((int)uVar9 <= (int)uVar5) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecBit.h"
                      ,0x132,"void Vec_BitWriteEntry(Vec_Bit_t *, int, int)");
      }
      puVar1 = (uint *)((long)__s + (ulong)(uVar5 >> 5) * 4);
      *puVar1 = *puVar1 | 1 << ((byte)uVar5 & 0x1f);
    }
    iVar4 = vFadds->nSize;
    iVar12 = iVar12 + 5;
  }
  Gia_ManIncrementTravId(p);
  uVar5 = 0;
  if ((int)uVar9 < 1) {
    uVar9 = uVar5;
  }
  iFaddTop = 0;
  do {
    if (vFadds->nSize / 5 <= (int)iFaddTop) {
      free(__s);
      Vec_IntFree(p_00);
      return pVVar7;
    }
    if (iFaddTop == uVar9) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecBit.h"
                    ,0x121,"int Vec_BitEntry(Vec_Bit_t *, int)");
    }
    if ((*(uint *)((long)__s + (ulong)(iFaddTop >> 5) * 4) >> (iFaddTop & 0x1f) & 1) == 0) {
      Gia_ManCollectOneChain(p,vFadds,iFaddTop,vMap,p_00);
      iVar4 = p_00->nSize;
      if (nFaddMin <= iVar4) {
        uVar11 = (uint)uVar13;
        if (uVar5 == uVar11) {
          uVar10 = uVar11 * 2;
          if ((int)uVar11 < 0x10) {
            uVar10 = 0x10;
          }
          if (uVar10 - uVar11 != 0 && (int)uVar11 <= (int)uVar10) {
            if (local_40 == (Vec_Int_t *)0x0) {
              local_40 = (Vec_Int_t *)malloc((ulong)uVar10 << 4);
            }
            else {
              local_40 = (Vec_Int_t *)realloc(local_40,(ulong)uVar10 << 4);
            }
            pVVar7->pArray = local_40;
            memset(local_40 + (int)uVar11,0,(long)(int)(uVar10 - uVar11) << 4);
            pVVar7->nCap = uVar10;
            uVar11 = uVar10;
          }
        }
        uVar10 = uVar5 + 1;
        pVVar7->nSize = uVar10;
        if ((int)uVar5 < 0) {
          __assert_fail("p->nSize > 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecWec.h"
                        ,0x9f,"Vec_Int_t *Vec_WecEntryLast(Vec_Wec_t *)");
        }
        Vec_IntAppend(local_40 + ((ulong)uVar10 - 1),p_00);
        iVar8 = 0;
        if (iVar4 < 1) {
          iVar4 = iVar8;
        }
        for (; iVar4 != iVar8; iVar8 = iVar8 + 1) {
          iVar12 = Vec_IntEntry(p_00,iVar8);
          i = iVar12 * 5 + 3;
          iVar6 = Vec_IntEntry(vFadds,i);
          iVar6 = Gia_ObjIsTravIdCurrentId(p,iVar6);
          if (iVar6 != 0) {
            __assert_fail("!Gia_ObjIsTravIdCurrentId(p, Vec_IntEntry(vFadds, 5*iFadd+3))",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/acec/acecFadds.c"
                          ,0x20b,
                          "Vec_Wec_t *Gia_ManCollectTopmost(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, int)"
                         );
          }
          iVar6 = iVar12 * 5 + 4;
          iVar12 = Vec_IntEntry(vFadds,iVar6);
          iVar12 = Gia_ObjIsTravIdCurrentId(p,iVar12);
          if (iVar12 != 0) {
            __assert_fail("!Gia_ObjIsTravIdCurrentId(p, Vec_IntEntry(vFadds, 5*iFadd+4))",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/acec/acecFadds.c"
                          ,0x20c,
                          "Vec_Wec_t *Gia_ManCollectTopmost(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, int)"
                         );
          }
          iVar12 = Vec_IntEntry(vFadds,i);
          Gia_ManMarkWithTravId_rec(p,iVar12);
          iVar12 = Vec_IntEntry(vFadds,iVar6);
          Gia_ManMarkWithTravId_rec(p,iVar12);
        }
        uVar13 = (ulong)uVar11;
        uVar5 = uVar10;
      }
    }
    iFaddTop = iFaddTop + 1;
  } while( true );
}

Assistant:

Vec_Wec_t * Gia_ManCollectTopmost( Gia_Man_t * p, Vec_Int_t * vFadds, Vec_Int_t * vMap, int nFaddMin )
{
    int i, j, iFadd;
    Vec_Int_t * vChain  = Vec_IntAlloc( 100 );
    Vec_Wec_t * vChains = Vec_WecAlloc( Vec_IntSize(vFadds)/5 );
    // erase elements appearing as FADD inputs
    Vec_Bit_t * vMarksTop = Vec_BitStart( Vec_IntSize(vFadds)/5 );
    Dtc_ForEachFadd( vFadds, i )
        if ( (iFadd = Vec_IntEntry(vMap, Vec_IntEntry(vFadds, 5*i+0))) >= 0 )
            Vec_BitWriteEntry( vMarksTop, iFadd, 1 );
    // compress the remaining ones
    Gia_ManIncrementTravId( p );
    Dtc_ForEachFadd( vFadds, i )
    {
        if ( Vec_BitEntry(vMarksTop, i) )
            continue;
        Gia_ManCollectOneChain( p, vFadds, i, vMap, vChain );
        if ( Vec_IntSize(vChain) < nFaddMin )
            continue;
        Vec_IntAppend( Vec_WecPushLevel(vChains), vChain );
        Vec_IntForEachEntry( vChain, iFadd, j )
        {
            assert( !Gia_ObjIsTravIdCurrentId(p, Vec_IntEntry(vFadds, 5*iFadd+3)) );
            assert( !Gia_ObjIsTravIdCurrentId(p, Vec_IntEntry(vFadds, 5*iFadd+4)) );
            Gia_ManMarkWithTravId_rec( p, Vec_IntEntry(vFadds, 5*iFadd+3) );
            Gia_ManMarkWithTravId_rec( p, Vec_IntEntry(vFadds, 5*iFadd+4) );
        }
    }
    // cleanup
    Vec_BitFree( vMarksTop );
    Vec_IntFree( vChain );
    return vChains;
}